

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_4,_4> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,4,4>
          (Matrix<float,_4,_4> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_4> *a,
          Vector<float,_4> *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector<float,_4> *pVVar6;
  Matrix<float,_4,_4> *res;
  int r;
  float *pfVar7;
  long lVar8;
  int row;
  long lVar9;
  long lVar10;
  undefined4 uVar11;
  Matrix<float,_4,_4> retVal;
  
  res = __return_storage_ptr__;
  pfVar7 = (float *)&retVal;
  retVal.m_data.m_data[3].m_data[0] = 0.0;
  retVal.m_data.m_data[3].m_data[1] = 0.0;
  retVal.m_data.m_data[3].m_data[2] = 0.0;
  retVal.m_data.m_data[3].m_data[3] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  retVal.m_data.m_data[2].m_data[2] = 0.0;
  retVal.m_data.m_data[2].m_data[3] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[3] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[0].m_data[3] = 0.0;
  lVar8 = 0;
  lVar9 = 0;
  do {
    lVar10 = 0;
    do {
      uVar11 = 0x3f800000;
      if (lVar8 != lVar10) {
        uVar11 = 0;
      }
      *(undefined4 *)((long)pfVar7 + lVar10) = uVar11;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x40);
    lVar9 = lVar9 + 1;
    pfVar7 = pfVar7 + 1;
    lVar8 = lVar8 + 0x10;
  } while (lVar9 != 4);
  fVar2 = *(float *)this;
  fVar3 = *(float *)(this + 4);
  fVar4 = *(float *)(this + 8);
  fVar5 = *(float *)(this + 0xc);
  lVar8 = 0;
  do {
    fVar1 = a->m_data[lVar8];
    retVal.m_data.m_data[0].m_data[lVar8] = fVar1 * fVar2;
    retVal.m_data.m_data[1].m_data[lVar8] = fVar1 * fVar3;
    retVal.m_data.m_data[2].m_data[lVar8] = fVar1 * fVar4;
    retVal.m_data.m_data[3].m_data[lVar8] = fVar1 * fVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  (__return_storage_ptr__->m_data).m_data[3].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[1] = 0.0;
  pVVar6 = (__return_storage_ptr__->m_data).m_data;
  pVVar6[3].m_data[2] = 0.0;
  pVVar6[3].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar6 = (__return_storage_ptr__->m_data).m_data;
  pVVar6[2].m_data[2] = 0.0;
  pVVar6[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar6 = (__return_storage_ptr__->m_data).m_data;
  pVVar6[1].m_data[2] = 0.0;
  pVVar6[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  lVar8 = 0;
  lVar9 = 0;
  pfVar7 = (float *)__return_storage_ptr__;
  do {
    lVar10 = 0;
    do {
      uVar11 = 0x3f800000;
      if (lVar8 != lVar10) {
        uVar11 = 0;
      }
      *(undefined4 *)((long)pfVar7 + lVar10) = uVar11;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x40);
    lVar9 = lVar9 + 1;
    pfVar7 = pfVar7 + 1;
    lVar8 = lVar8 + 0x10;
  } while (lVar9 != 4);
  lVar8 = 0;
  do {
    fVar2 = *(float *)((long)retVal.m_data.m_data[1].m_data + lVar8);
    fVar3 = *(float *)((long)retVal.m_data.m_data[2].m_data + lVar8);
    fVar4 = *(float *)((long)retVal.m_data.m_data[3].m_data + lVar8);
    pfVar7 = (__return_storage_ptr__->m_data).m_data[0].m_data + lVar8;
    *pfVar7 = *(float *)((long)retVal.m_data.m_data[0].m_data + lVar8);
    pfVar7[1] = fVar2;
    pfVar7[2] = fVar3;
    pfVar7[3] = fVar4;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x10);
  return res;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}